

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData *
cfd::core::CryptoUtil::ConvertSignatureToDer
          (ByteData *__return_storage_ptr__,string *hex_string,SigHashType *sighash_type)

{
  ByteData local_30;
  
  ByteData::ByteData(&local_30,(string *)hex_string);
  ConvertSignatureToDer(__return_storage_ptr__,&local_30,sighash_type);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::ConvertSignatureToDer(
    const std::string &hex_string, const SigHashType &sighash_type) {
  return ConvertSignatureToDer(ByteData(hex_string), sighash_type);
}